

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_number_set_unit(coda_type_number *type,char *unit)

{
  char *pcVar1;
  
  if (unit == (char *)0x0) {
    coda_set_error(-100,"unit argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x6f2);
  }
  else {
    if (type->unit == (char *)0x0) {
      pcVar1 = strdup(unit);
      type->unit = pcVar1;
      if (pcVar1 != (char *)0x0) {
        return 0;
      }
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                     ,0x6fe);
      return -1;
    }
    coda_set_error(-400,"type already has a unit");
  }
  return -1;
}

Assistant:

int coda_type_number_set_unit(coda_type_number *type, const char *unit)
{
    if (unit == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "unit argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->unit != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "type already has a unit");
        return -1;
    }
    type->unit = strdup(unit);
    if (type->unit == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }

    return 0;
}